

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O3

vm_obj_id_t CVmObjBigNum::create_from_stack(uchar **pc_ptr,uint argc)

{
  ushort uVar1;
  vm_val_t *pvVar2;
  int iVar3;
  undefined4 obj_id;
  ushort *puVar4;
  char *pcVar5;
  CVmObjBigNum *pCVar6;
  size_t digits;
  vm_val_t new_val;
  vm_val_t local_40;
  
  pvVar2 = sp_;
  if (argc - 3 < 0xfffffffe) {
    err_throw(0x899);
  }
  if (sp_[-1].typ == VM_INT) {
    puVar4 = (ushort *)0x0;
LAB_002301a9:
    pcVar5 = (char *)0x0;
  }
  else {
    if ((sp_[-1].typ != VM_OBJ) ||
       (iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1].val.obj >> 0xc]
                                       [sp_[-1].val.obj & 0xfff].ptr_ + 8))(), iVar3 == 0)) {
      puVar4 = (ushort *)vm_val_t::get_as_string(pvVar2 + -1);
      if (puVar4 == (ushort *)0x0) {
        err_throw(0x7d4);
      }
      goto LAB_002301a9;
    }
    pcVar5 = (G_obj_table_X.pages_[pvVar2[-1].val.obj >> 0xc]->ptr_).obj_ +
             (pvVar2[-1].val.obj & 0xfff) * 0x18;
    puVar4 = (ushort *)0x0;
  }
  if (argc < 2) {
    if (puVar4 == (ushort *)0x0) {
      if (pcVar5 == (char *)0x0) {
        digits = 0x20;
        goto LAB_0023028f;
      }
      puVar4 = *(ushort **)(pcVar5 + 8);
      digits = (size_t)*puVar4;
      goto LAB_0023026e;
    }
    iVar3 = precision_from_string((char *)(puVar4 + 1),(ulong)*puVar4,10);
    digits = (size_t)iVar3;
  }
  else {
    if (sp_[-2].typ != VM_INT) {
      err_throw(0x7d5);
    }
    digits = (size_t)sp_[-2].val.intval;
    if (puVar4 == (ushort *)0x0) {
      if (pcVar5 == (char *)0x0) {
LAB_0023028f:
        obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
        pCVar6 = (CVmObjBigNum *)CVmObject::operator_new(0x10,obj_id);
        iVar3 = pvVar2[-1].val.intval;
        (pCVar6->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00309a78;
        alloc_bignum(pCVar6,digits);
        set_int_val((pCVar6->super_CVmObject).ext_,(long)iVar3);
        goto LAB_002302dc;
      }
      puVar4 = *(ushort **)(pcVar5 + 8);
LAB_0023026e:
      round_val(&local_40,(char *)puVar4,digits,1);
      obj_id = local_40.val.obj;
      goto LAB_002302dc;
    }
  }
  obj_id = CVmObjTable::alloc_obj(&G_obj_table_X,0,0,0);
  pCVar6 = (CVmObjBigNum *)CVmObject::operator_new(0x10,obj_id);
  uVar1 = *puVar4;
  (pCVar6->super_CVmObject)._vptr_CVmObject = (_func_int **)&PTR_get_metaclass_reg_00309a78;
  alloc_bignum(pCVar6,digits);
  parse_str_into((pCVar6->super_CVmObject).ext_,(char *)(puVar4 + 1),(ulong)uVar1);
LAB_002302dc:
  sp_ = sp_ + -(ulong)argc;
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjBigNum::create_from_stack(VMG_ const uchar **pc_ptr,
                                            uint argc)
{
    vm_obj_id_t id;
    vm_val_t *val;
    size_t digits;
    const char *strval = 0;
    const CVmObjBigNum *objval = 0;

    /* check arguments */
    if (argc < 1 || argc > 2)
        err_throw(VMERR_WRONG_NUM_OF_ARGS);

    /* 
     *   check the first argument, which gives the source value - this can be
     *   an integer, a string, or another BigNumber value 
     */
    val = G_stk->get(0);
    if (val->typ == VM_INT)
    {
        /* we'll use the integer value */
    }
    else if (val->typ == VM_OBJ && is_bignum_obj(vmg_ val->val.obj))
    {
        /* we'll use the BigNumber value as the source */
        objval = (CVmObjBigNum *)vm_objp(vmg_ val->val.obj);
    }
    else if ((strval = val->get_as_string(vmg0_)) != 0)
    {
        /* we'll parse the string value */
    }
    else
    {
        /* it's not a source type we accept */
        err_throw(VMERR_NUM_VAL_REQD);
    }

    /* 
     *   get the precision value, if provided; if not, infer it from the
     *   source value 
     */
    if (argc > 1)
    {
        /* make sure it's an integer */
        if (G_stk->get(1)->typ != VM_INT)
            err_throw(VMERR_INT_VAL_REQD);

        /* retrieve the value */
        digits = (size_t)G_stk->get(1)->val.intval;
    }
    else if (strval != 0)
    {
        /* parse the string to infer the precision */
        digits = precision_from_string(
            strval + VMB_LEN, vmb_get_len(strval), 10);
    }
    else if (objval != 0)
    {
        /* use the same precision as the source BigNumber value */
        digits = get_prec(objval->get_ext());
    }
    else
    {
        /* use a default precision */
        digits = 32;
    }

    /* create the value */
    if (strval != 0)
    {
        /* create the value from the string */
        id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
        new (vmg_ id) CVmObjBigNum(vmg_ strval + VMB_LEN,
                                   vmb_get_len(strval), digits);
    }
    else if (objval != 0)
    {
        vm_val_t new_val;

        /* create the value based on the BigNumber value */
        round_val(vmg_ &new_val, objval->get_ext(), digits, TRUE);

        /* return the new object ID */
        id = new_val.val.obj;
    }
    else
    {
        /* create the value based on the integer value */
        id = vm_new_id(vmg_ FALSE, FALSE, FALSE);
        new (vmg_ id) CVmObjBigNum(vmg_ (long)val->val.intval, digits);
    }

    /* discard arguments */
    G_stk->discard(argc);

    /* return the new object */
    return id;
}